

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O1

void __thiscall zmq::socks_connecter_t::error(socks_connecter_t *this)

{
  handle_t handle_;
  
  handle_ = (this->super_stream_connecter_base_t)._handle;
  io_object_t::rm_fd(&(this->super_stream_connecter_base_t).super_io_object_t,handle_);
  stream_connecter_base_t::close(&this->super_stream_connecter_base_t,(int)handle_);
  socks_greeting_encoder_t::reset(&this->_greeting_encoder);
  socks_choice_decoder_t::reset(&this->_choice_decoder);
  socks_basic_auth_request_encoder_t::reset(&this->_basic_auth_request_encoder);
  socks_auth_response_decoder_t::reset(&this->_auth_response_decoder);
  socks_request_encoder_t::reset(&this->_request_encoder);
  socks_response_decoder_t::reset(&this->_response_decoder);
  this->_status = 0;
  stream_connecter_base_t::add_reconnect_timer(&this->super_stream_connecter_base_t);
  return;
}

Assistant:

void zmq::socks_connecter_t::error ()
{
    rm_fd (_handle);
    close ();
    _greeting_encoder.reset ();
    _choice_decoder.reset ();
    _basic_auth_request_encoder.reset ();
    _auth_response_decoder.reset ();
    _request_encoder.reset ();
    _response_decoder.reset ();
    _status = unplugged;
    add_reconnect_timer ();
}